

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_automaticIdsTestValues_Test::TestBody(Annotator_automaticIdsTestValues_Test *this)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  char *pcVar7;
  AssertHelper local_6a8 [8];
  Message local_6a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  undefined1 local_678 [8];
  AssertionResult gtest_ar_19;
  Message local_660 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  undefined1 local_638 [8];
  AssertionResult gtest_ar_18;
  Message local_620 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_17;
  Message local_5e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar_16;
  Message local_5a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_15;
  Message local_560 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_14;
  Message local_520 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_13;
  Message local_4e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_12;
  Message local_4a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_11;
  Message local_460 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_408 [8];
  Message local_400 [15];
  bool local_3f1;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_3c0 [8];
  Message local_3b8 [15];
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_;
  Message local_390 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_9;
  Message local_350 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_8;
  Message local_310 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_7;
  Message local_2d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_6;
  Message local_290 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_5;
  Message local_250 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_4;
  Message local_210 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_3;
  Message local_1d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_2;
  Message local_190 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  Message local_150 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  ResetPtr reset3;
  ResetPtr reset2;
  ResetPtr reset1;
  string local_e0 [32];
  undefined1 local_c0 [8];
  ComponentPtr component3;
  string local_a8 [32];
  undefined1 local_88 [8];
  ComponentPtr component2;
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  ComponentPtr component1;
  ModelPtr model;
  AnnotatorPtr annotator;
  Annotator_automaticIdsTestValues_Test *this_local;
  
  libcellml::Annotator::create();
  libcellml::Model::create();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"c1",&local_61);
  libcellml::Component::create((string *)local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"c2",
             (allocator<char> *)
             ((long)&component3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::Component::create((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&component3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e0,"c3",
             (allocator<char> *)
             ((long)&reset1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create((string *)local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&reset1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Reset::create();
  libcellml::Reset::create();
  libcellml::Reset::create();
  peVar3 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&reset2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Reset::setTestValue((string *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&reset3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Reset::setTestValue((string *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  libcellml::Reset::setTestValue((string *)peVar3);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  libcellml::Component::addReset((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
  libcellml::Component::addReset((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  libcellml::Component::addReset((shared_ptr *)peVar4);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&component1.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar5);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&component1.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar5);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  peVar6 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::setModel((shared_ptr *)peVar6);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &component1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_128,"\"\"","model->id()",(char (*) [1])0x19fc0a,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(local_150);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x36b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_40);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_168,"\"\"","component1->id()",(char (*) [1])0x19fc0a,
             &local_188);
  std::__cxx11::string::~string((string *)&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(local_190);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x36c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_88);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_1a8,"\"\"","component2->id()",(char (*) [1])0x19fc0a,
             &local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(local_1d0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x36d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_c0);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_1e8,"\"\"","component3->id()",(char (*) [1])0x19fc0a,
             &local_208);
  std::__cxx11::string::~string((string *)&local_208);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(local_210);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x36e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &reset2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_228,"\"\"","reset1->id()",(char (*) [1])0x19fc0a,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(local_250);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x36f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &reset3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_268,"\"\"","reset2->id()",(char (*) [1])0x19fc0a,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(local_290);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x370,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_2a8,"\"\"","reset3->id()",(char (*) [1])0x19fc0a,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(local_2d0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x371,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &reset2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_2e8,"\"\"","reset1->testValueId()",(char (*) [1])0x19fc0a,
             &local_308);
  std::__cxx11::string::~string((string *)&local_308);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(local_310);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x372,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &reset3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_328,"\"\"","reset2->testValueId()",(char (*) [1])0x19fc0a,
             &local_348);
  std::__cxx11::string::~string((string *)&local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(local_350);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x373,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_368,"\"\"","reset3->testValueId()",(char (*) [1])0x19fc0a,
             &local_388);
  std::__cxx11::string::~string((string *)&local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(local_390);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x374,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  peVar6 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  bVar2 = libcellml::Annotator::assignIds((CellmlElementType)peVar6);
  local_3a9 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_3a8,
               "annotator->assignIds(libcellml::CellmlElementType::TEST_VALUE)","false");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x376,pcVar7);
    testing::internal::AssertHelper::operator=(local_3c0,local_3b8);
    testing::internal::AssertHelper::~AssertHelper(local_3c0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar2 = libcellml::Annotator::hasModel();
  local_3f1 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f0,&local_3f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(local_400);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_10.message_,local_3f0,"annotator->hasModel()","false");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x377,pcVar7);
    testing::internal::AssertHelper::operator=(local_408,local_400);
    testing::internal::AssertHelper::~AssertHelper(local_408);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &component1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_438,"\"\"","model->id()",(char (*) [1])0x19fc0a,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(local_460);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x379,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_40);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_478,"\"\"","component1->id()",(char (*) [1])0x19fc0a,
             &local_498);
  std::__cxx11::string::~string((string *)&local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(local_4a0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x37a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_88);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_4b8,"\"\"","component2->id()",(char (*) [1])0x19fc0a,
             &local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(local_4e0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x37b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_c0);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_4f8,"\"\"","component3->id()",(char (*) [1])0x19fc0a,
             &local_518);
  std::__cxx11::string::~string((string *)&local_518);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(local_520);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x37c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_520);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &reset2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_538,"\"\"","reset1->id()",(char (*) [1])0x19fc0a,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar1) {
    testing::Message::Message(local_560);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x37d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_560);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &reset3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_578,"\"\"","reset2->id()",(char (*) [1])0x19fc0a,&local_598);
  std::__cxx11::string::~string((string *)&local_598);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar1) {
    testing::Message::Message(local_5a0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x37e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_5a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_5a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_5b8,"\"\"","reset3->id()",(char (*) [1])0x19fc0a,&local_5d8);
  std::__cxx11::string::~string((string *)&local_5d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(local_5e0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_5b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x37f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &reset2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_5f8,"\"b4da55\"","reset1->testValueId()",
             (char (*) [7])"b4da55",&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(local_620);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x380,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &reset3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_638,"\"b4da56\"","reset2->testValueId()",
             (char (*) [7])"b4da56",&local_658);
  std::__cxx11::string::~string((string *)&local_658);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar1) {
    testing::Message::Message(local_660);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_638);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x381,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,local_660);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(local_660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_678,"\"b4da57\"","reset3->testValueId()",
             (char (*) [7])"b4da57",&local_698);
  std::__cxx11::string::~string((string *)&local_698);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar1) {
    testing::Message::Message(local_6a0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_678);
    testing::internal::AssertHelper::AssertHelper
              (local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x382,pcVar7);
    testing::internal::AssertHelper::operator=(local_6a8,local_6a0);
    testing::internal::AssertHelper::~AssertHelper(local_6a8);
    testing::Message::~Message(local_6a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)&gtest_ar.message_)
  ;
  std::shared_ptr<libcellml::Reset>::~shared_ptr
            ((shared_ptr<libcellml::Reset> *)
             &reset3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Reset>::~shared_ptr
            ((shared_ptr<libcellml::Reset> *)
             &reset2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_c0);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_88);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_40);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &component1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Annotator, automaticIdsTestValues)
{
    auto annotator = libcellml::Annotator::create();
    auto model = libcellml::Model::create();
    auto component1 = libcellml::Component::create("c1");
    auto component2 = libcellml::Component::create("c2");
    auto component3 = libcellml::Component::create("c3");
    auto reset1 = libcellml::Reset::create();
    auto reset2 = libcellml::Reset::create();
    auto reset3 = libcellml::Reset::create();
    reset1->setTestValue(NON_EMPTY_MATH);
    reset2->setTestValue(NON_EMPTY_MATH);
    reset3->setTestValue(NON_EMPTY_MATH);

    component1->addReset(reset1);
    component2->addReset(reset2);
    component3->addReset(reset3);

    model->addComponent(component1);
    model->addComponent(component2);
    component2->addComponent(component3);

    annotator->setModel(model);

    EXPECT_EQ("", model->id());
    EXPECT_EQ("", component1->id());
    EXPECT_EQ("", component2->id());
    EXPECT_EQ("", component3->id());
    EXPECT_EQ("", reset1->id());
    EXPECT_EQ("", reset2->id());
    EXPECT_EQ("", reset3->id());
    EXPECT_EQ("", reset1->testValueId());
    EXPECT_EQ("", reset2->testValueId());
    EXPECT_EQ("", reset3->testValueId());

    EXPECT_TRUE(annotator->assignIds(libcellml::CellmlElementType::TEST_VALUE));
    EXPECT_TRUE(annotator->hasModel());

    EXPECT_EQ("", model->id());
    EXPECT_EQ("", component1->id());
    EXPECT_EQ("", component2->id());
    EXPECT_EQ("", component3->id());
    EXPECT_EQ("", reset1->id());
    EXPECT_EQ("", reset2->id());
    EXPECT_EQ("", reset3->id());
    EXPECT_EQ("b4da55", reset1->testValueId());
    EXPECT_EQ("b4da56", reset2->testValueId());
    EXPECT_EQ("b4da57", reset3->testValueId());
}